

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

Switch * __thiscall
wasm::Builder::makeSwitch<std::vector<wasm::Name,std::allocator<wasm::Name>>>
          (Builder *this,vector<wasm::Name,_std::allocator<wasm::Name>_> *list,Name default_,
          Expression *condition,Expression *value)

{
  Switch *pSVar1;
  Switch *ret;
  Expression *value_local;
  Expression *condition_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *list_local;
  Builder *this_local;
  Name default__local;
  
  default__local.super_IString.str._M_len = default_.super_IString.str._M_str;
  this_local = default_.super_IString.str._M_len;
  pSVar1 = MixedArena::alloc<wasm::Switch>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name>::
  set<std::vector<wasm::Name,std::allocator<wasm::Name>>>
            ((ArenaVectorBase<ArenaVector<wasm::Name>,wasm::Name> *)&pSVar1->targets,list);
  wasm::Name::operator=(&pSVar1->default_,(Name *)&this_local);
  pSVar1->value = value;
  pSVar1->condition = condition;
  return pSVar1;
}

Assistant:

Switch* makeSwitch(T& list,
                     Name default_,
                     Expression* condition,
                     Expression* value = nullptr) {
    auto* ret = wasm.allocator.alloc<Switch>();
    ret->targets.set(list);
    ret->default_ = default_;
    ret->value = value;
    ret->condition = condition;
    return ret;
  }